

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerManager.cpp
# Opt level: O0

void __thiscall
TimerManager::removeAgentsByReceiver(TimerManager *this,void *receiver,IEventDispatcher *dispatcher)

{
  uint uVar1;
  Timer **ppTVar2;
  uint local_3c;
  undefined1 local_38 [4];
  uint i;
  AutoLock l;
  IEventDispatcher *dispatcher_local;
  void *receiver_local;
  TimerManager *this_local;
  
  l._16_8_ = dispatcher;
  AutoLock::AutoLock((AutoLock *)local_38,&this->mMutex);
  local_3c = 0;
  while( true ) {
    uVar1 = JetHead::vector<Timer_*>::size(&this->mTimers);
    if (uVar1 <= local_3c) break;
    ppTVar2 = JetHead::vector<Timer_*>::operator[](&this->mTimers,local_3c);
    Timer::removeAgentsByReceiver(*ppTVar2,receiver,(IEventDispatcher *)l._16_8_);
    local_3c = local_3c + 1;
  }
  AutoLock::~AutoLock((AutoLock *)local_38);
  return;
}

Assistant:

void TimerManager::removeAgentsByReceiver( void* receiver,
										   IEventDispatcher* dispatcher )
{
	// Lock mutex while accessing/modifying mTimers vector
	AutoLock l(mMutex);
	
	for (unsigned i = 0; i < mTimers.size(); ++i)
	{
		mTimers[i]->removeAgentsByReceiver(receiver, dispatcher);
	}
}